

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.c
# Opt level: O3

PyObject * libxml_xmlValidCtxtPtrWrap(xmlValidCtxtPtr valid)

{
  PyObject *pPVar1;
  
  if (valid != (xmlValidCtxtPtr)0x0) {
    pPVar1 = (PyObject *)PyCapsule_New(valid,"xmlValidCtxtPtr",0);
    return pPVar1;
  }
  __Py_NoneStruct = __Py_NoneStruct + 1;
  return (PyObject *)&_Py_NoneStruct;
}

Assistant:

PyObject *
libxml_xmlValidCtxtPtrWrap(xmlValidCtxtPtr valid)
{
	PyObject *ret;

#ifdef DEBUG
	printf("libxml_xmlValidCtxtPtrWrap: valid = %p\n", valid);
#endif
	if (valid == NULL) {
		Py_INCREF(Py_None);
		return (Py_None);
	}

	ret = 
		PyCapsule_New((void *) valid,
									 (char *) "xmlValidCtxtPtr", NULL);

	return (ret);
}